

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIDFontWriter.cpp
# Opt level: O3

EStatusCode __thiscall
CIDFontWriter::WriteFont
          (CIDFontWriter *this,FreeTypeFaceWrapper *inFontInfo,
          WrittenFontRepresentation *inFontOccurrence,ObjectsContext *inObjectsContext,
          IDescendentFontWriter *inDescendentFontWriter,bool inEmbedFont)

{
  EStatusCode EVar1;
  Trace *pTVar2;
  DictionaryContext *this_00;
  long *plVar3;
  IndirectObjectsReferenceRegistry *pIVar4;
  ObjectIDType indirectObjectID;
  ObjectIDType inObjectReference;
  long *plVar5;
  size_type *psVar6;
  string fontName;
  string postscriptFontName;
  string local_b8;
  IDescendentFontWriter *local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  EVar1 = ObjectsContext::StartNewIndirectObject
                    (inObjectsContext,inFontOccurrence->mWrittenObjectID);
  if (EVar1 != eSuccess) {
    pTVar2 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar2,
                      "CIDFontWriter::WriteFont, unexpected failure. could not write font object %ld"
                      ,inFontOccurrence->mWrittenObjectID);
    return EVar1;
  }
  this->mFontInfo = inFontInfo;
  this->mFontOccurrence = inFontOccurrence;
  this->mObjectsContext = inObjectsContext;
  local_98 = inDescendentFontWriter;
  this_00 = ObjectsContext::StartDictionary(inObjectsContext);
  DictionaryContext::WriteKey(this_00,&scType_abi_cxx11_);
  DictionaryContext::WriteNameValue(this_00,&scFont_abi_cxx11_);
  DictionaryContext::WriteKey(this_00,&scSubtype_abi_cxx11_);
  DictionaryContext::WriteNameValue(this_00,&scType0_abi_cxx11_);
  DictionaryContext::WriteKey(this_00,&scBaseFont_abi_cxx11_);
  FreeTypeFaceWrapper::GetPostscriptName_abi_cxx11_(&local_70,inFontInfo);
  if (local_70._M_string_length == 0) {
    pTVar2 = Trace::DefaultTrace();
    EVar1 = eFailure;
    Trace::TraceToLog(pTVar2,
                      "CIDFontWriter::WriteFont, unexpected failure. no postscript font name for font"
                     );
    goto LAB_002005fb;
  }
  if (inEmbedFont) {
    ObjectsContext::GenerateSubsetFontPrefix_abi_cxx11_(&local_50,inObjectsContext);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_50,(ulong)scPlus_abi_cxx11_._M_dataplus._M_p);
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_80 = *plVar5;
      lStack_78 = plVar3[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar5;
      local_90 = (long *)*plVar3;
    }
    local_88 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_b8.field_2._M_allocated_capacity = *psVar6;
      local_b8.field_2._8_8_ = plVar3[3];
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar6;
      local_b8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_b8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
  }
  DictionaryContext::WriteNameValue(this_00,&local_b8);
  DictionaryContext::WriteKey(this_00,&scEncoding_abi_cxx11_);
  DictionaryContext::WriteNameValue(this_00,&scIdentityH_abi_cxx11_);
  pIVar4 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
  indirectObjectID = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar4);
  DictionaryContext::WriteKey(this_00,&scDescendantFonts_abi_cxx11_);
  ObjectsContext::StartArray(this->mObjectsContext);
  ObjectsContext::WriteNewIndirectObjectReference
            (this->mObjectsContext,indirectObjectID,eTokenSeparatorSpace);
  ObjectsContext::EndArray(this->mObjectsContext,eTokenSeparatorEndLine);
  CalculateCharacterEncodingArray(this);
  if ((ulong)(((long)(this->mCharactersVector).
                     super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->mCharactersVector).
                     super__Vector_base<std::pair<unsigned_int,_GlyphEncodingInfo>,_std::allocator<std::pair<unsigned_int,_GlyphEncodingInfo>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 2) {
    EVar1 = ObjectsContext::EndDictionary(inObjectsContext,this_00);
    if (EVar1 == eSuccess) {
      ObjectsContext::EndIndirectObject(inObjectsContext);
LAB_002005b3:
      EVar1 = (*local_98->_vptr_IDescendentFontWriter[2])
                        (local_98,indirectObjectID,&local_b8,this->mFontInfo,
                         &this->mCharactersVector,this->mObjectsContext,inEmbedFont);
    }
    else {
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,
                        "CIDFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write."
                       );
    }
  }
  else {
    DictionaryContext::WriteKey(this_00,&scToUnicode_abi_cxx11_);
    pIVar4 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
    inObjectReference = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar4);
    DictionaryContext::WriteNewObjectReferenceValue(this_00,inObjectReference);
    EVar1 = ObjectsContext::EndDictionary(inObjectsContext,this_00);
    if (EVar1 == eSuccess) {
      ObjectsContext::EndIndirectObject(inObjectsContext);
      EVar1 = WriteToUnicodeMap(this,inObjectReference);
      if (EVar1 == eSuccess) goto LAB_002005b3;
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,"CIDFontWriter::WriteFont, failed to write unicode map %ld",
                        inObjectReference);
    }
    else {
      pTVar2 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar2,
                        "CIDFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write."
                       );
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
LAB_002005fb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return EVar1;
}

Assistant:

EStatusCode CIDFontWriter::WriteFont(FreeTypeFaceWrapper& inFontInfo,
										WrittenFontRepresentation* inFontOccurrence,
										ObjectsContext* inObjectsContext,
										IDescendentFontWriter* inDescendentFontWriter,
										bool inEmbedFont)
{

	EStatusCode status = PDFHummus::eSuccess;

	do
	{
		status = inObjectsContext->StartNewIndirectObject(inFontOccurrence->mWrittenObjectID);
		if(status != eSuccess)
		{
			TRACE_LOG1("CIDFontWriter::WriteFont, unexpected failure. could not write font object %ld",inFontOccurrence->mWrittenObjectID);
			break;
		}

		mFontInfo = &inFontInfo;
		mFontOccurrence = inFontOccurrence;
		mObjectsContext = inObjectsContext;
		DictionaryContext* fontContext = inObjectsContext->StartDictionary();

		// Type
		fontContext->WriteKey(scType);
		fontContext->WriteNameValue(scFont);

		// SubType
		fontContext->WriteKey(scSubtype);
		fontContext->WriteNameValue(scType0);

		// BaseFont
		fontContext->WriteKey(scBaseFont);
		std::string postscriptFontName = inFontInfo.GetPostscriptName();
		if(postscriptFontName.length() == 0)
		{
			TRACE_LOG("CIDFontWriter::WriteFont, unexpected failure. no postscript font name for font");
			status = PDFHummus::eFailure;
			break;
		}
		std::string fontName = inEmbedFont ? (inObjectsContext->GenerateSubsetFontPrefix() + scPlus + postscriptFontName) : postscriptFontName;
		fontContext->WriteNameValue(fontName);

		WriteEncoding(fontContext);

		// DescendantFonts 
		ObjectIDType descendantFontID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();

		fontContext->WriteKey(scDescendantFonts);
		mObjectsContext->StartArray();
		mObjectsContext->WriteNewIndirectObjectReference(descendantFontID);
		mObjectsContext->EndArray(eTokenSeparatorEndLine);

		CalculateCharacterEncodingArray(); // put the charachter in the order of encoding, for the ToUnicode map

		// ToUnicode
		if (mCharactersVector.size() > 1) {
			// make sure there's more than just the 0 char (which would make this an array of size of one
			fontContext->WriteKey(scToUnicode);
			ObjectIDType toUnicodeMapObjectID = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
			fontContext->WriteNewObjectReferenceValue(toUnicodeMapObjectID);

			status = inObjectsContext->EndDictionary(fontContext);
			if (status != PDFHummus::eSuccess)
			{
				TRACE_LOG("CIDFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write.");
				break;
			}
			inObjectsContext->EndIndirectObject();
			status = WriteToUnicodeMap(toUnicodeMapObjectID);
			if (status != PDFHummus::eSuccess)
			{
				TRACE_LOG1("CIDFontWriter::WriteFont, failed to write unicode map %ld", toUnicodeMapObjectID);
				break;
			}			
		}
		else {
			// else just finish font writing (a bit of an edge case here...but should take care of, for cleanliness)
			status = inObjectsContext->EndDictionary(fontContext);
			if (status != PDFHummus::eSuccess)
			{
				TRACE_LOG("CIDFontWriter::WriteFont, unexpected failure. Failed to end dictionary in font write.");
				break;
			}
			inObjectsContext->EndIndirectObject();
		}

		// Write the descendant font
		status = inDescendentFontWriter->WriteFont(descendantFontID, fontName, *mFontInfo, mCharactersVector, mObjectsContext, inEmbedFont);

	} while(false);

	return status;
}